

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O3

void __thiscall w3Interp::Calli(w3Interp *this)

{
  pointer *ppwVar1;
  w3Module *pwVar2;
  pointer pwVar3;
  pointer pwVar4;
  ulong uVar5;
  bool bVar6;
  Value *pVVar7;
  ulong uVar8;
  ulong uVar9;
  w3FunctionType *this_00;
  ulong uVar10;
  w3FunctionType *this_01;
  
  this_00 = (w3FunctionType *)&this->super_w3Stack;
  pVVar7 = w3Stack::value((w3Stack *)this_00,Tag_i32);
  uVar10 = (ulong)pVVar7->u32;
  w3Stack::AssertTopIsValue((w3Stack *)this_00);
  ppwVar1 = &(this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
             super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppwVar1 = *ppwVar1 + -1;
  pwVar2 = this->module;
  pwVar3 = (pwVar2->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = ((long)(pwVar2->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pwVar3 >> 3) *
          -0x3333333333333333;
  if (uVar8 < uVar10 || uVar8 - uVar10 == 0) {
    Calli();
LAB_0011a07b:
    Calli();
LAB_0011a080:
    Calli();
  }
  else {
    uVar8 = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
    pwVar4 = (pwVar2->function_types).
             super__Vector_base<w3FunctionType,_std::allocator<w3FunctionType>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = ((long)(pwVar2->function_types).
                   super__Vector_base<w3FunctionType,_std::allocator<w3FunctionType>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pwVar4 >> 4) * -0x5555555555555555;
    if (uVar9 < uVar8 || uVar9 - uVar8 == 0) goto LAB_0011a07b;
    uVar5 = pwVar3[uVar10].function_type_index;
    if (uVar9 <= uVar5) goto LAB_0011a080;
    this_01 = pwVar4 + uVar8;
    if (uVar5 != uVar8) {
      this_00 = this_01;
      bVar6 = w3FunctionType::operator==(this_01,pwVar4 + uVar5);
      if (!bVar6) goto LAB_0011a08a;
    }
    if ((ulong)((long)(this_01->results).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this_01->results).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
                     super__Vector_impl_data._M_start) < 2) {
      Invoke(this,pwVar3 + uVar10);
      return;
    }
  }
  Calli();
LAB_0011a08a:
  Calli();
  w3Stack::AssertTopIsValue
            ((w3Stack *)
             &(((_Vector_base<w3StackValue,_std::allocator<w3StackValue>_> *)
               &(this_00->parameters).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl)->
              _M_impl).super__Vector_impl_data._M_end_of_storage);
  (this_00->results).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&((w3Module *)
                 (this_00->results).super__Vector_base<w3Tag,_std::allocator<w3Tag>_>._M_impl.
                 super__Vector_impl_data._M_start)[-1].start;
  return;
}

Assistant:

INTERP (Calli)
{
    // TODO signed or unsigned
    // call is unsigned
    const size_t function_index = pop_u32 ();

    const size_t type_index1 = instr->u32;

    // This seems like it could be validated earlier.
    Assert (function_index < module->functions.size ());

    w3Function& function = module->functions [function_index];

    const size_t type_index2 = function.function_type_index;

    Assert (type_index1 < module->function_types.size ());
    Assert (type_index2 < module->function_types.size ());

    const w3FunctionType* type1 = &module->function_types [type_index1];
    const w3FunctionType* type2 = &module->function_types [type_index2];

    Assert (type_index2 == type_index1 || *type1 == *type2);

    Assert (type1->results.size () <= 1); // future

    Invoke (function);
}